

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O0

DeepSlice * __thiscall Imf_2_5::DeepFrameBuffer::findSlice(DeepFrameBuffer *this,char *name)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator i;
  map<Imf_2_5::Name,_Imf_2_5::DeepSlice,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  *in_stack_fffffffffffffec8;
  Name *in_stack_fffffffffffffed0;
  DeepSlice *pDVar3;
  _Self local_120 [33];
  _Self local_18 [3];
  
  Name::Name(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::Name,_Imf_2_5::DeepSlice,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
       ::find(in_stack_fffffffffffffec8,(key_type *)0x2fd735);
  local_120[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::Name,_Imf_2_5::DeepSlice,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
       ::end(in_stack_fffffffffffffec8);
  bVar1 = std::operator==(local_18,local_120);
  if (bVar1) {
    pDVar3 = (DeepSlice *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>
                         *)in_stack_fffffffffffffed0);
    pDVar3 = &ppVar2->second;
  }
  return pDVar3;
}

Assistant:

const DeepSlice *
DeepFrameBuffer::findSlice (const char name[]) const
{
    SliceMap::const_iterator i = _map.find (name);
    return (i == _map.end())? 0: &i->second;
}